

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_symbol_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValue JVar2;
  JSValue *in_stack_00000020;
  int in_stack_0000002c;
  JSValue ret;
  JSValue val;
  JSContext *in_stack_ffffffffffffff80;
  JSContext *ctx_00;
  JSValue in_stack_ffffffffffffff88;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_10;
  undefined8 local_8;
  
  JVar2 = js_thisSymbolValue(in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
  local_68 = JVar2.u;
  local_60 = JVar2.tag;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    ctx_00 = (JSContext *)0x3;
    JVar2 = js_string_constructor
                      ((JSContext *)ret.u.ptr,stack0x00000038,in_stack_0000002c,in_stack_00000020);
    local_10 = JVar2.u;
    local_8 = JVar2.tag;
    JS_FreeValue(ctx_00,JVar2);
  }
  else {
    local_10 = local_68;
    local_8 = local_60;
  }
  JVar2.tag = local_8;
  JVar2.u.float64 = local_10;
  return JVar2;
}

Assistant:

static JSValue js_symbol_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValue val, ret;
    val = js_thisSymbolValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    /* XXX: use JS_ToStringInternal() with a flags */
    ret = js_string_constructor(ctx, JS_UNDEFINED, 1, (JSValueConst *)&val);
    JS_FreeValue(ctx, val);
    return ret;
}